

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

string * __thiscall
t_cpp_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_cpp_generator *this,t_type *ttype,bool in_typedef,
          bool arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  t_cpp_generator *ptVar5;
  string *this_00;
  key_type *this_01;
  t_set *tset;
  string class_prefix;
  string pname;
  string local_150;
  key_type local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ptVar5 = this;
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
    paVar1 = &local_150.field_2;
    local_150._M_dataplus._M_p = (pointer)paVar1;
    if ((char)iVar3 == '\0') {
      local_150._M_string_length = 0;
      local_150.field_2._M_local_buf[0] = '\0';
      if (in_typedef) {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
        if ((char)iVar3 == '\0') {
          iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
          if ((char)iVar3 == '\0') goto LAB_0016b487;
        }
        std::__cxx11::string::assign((char *)&local_150);
      }
LAB_0016b487:
      paVar1 = &local_130.field_2;
      local_130._M_string_length = 0;
      local_130.field_2._M_local_buf[0] = '\0';
      ptVar5 = (t_cpp_generator *)ttype->program_;
      local_130._M_dataplus._M_p = (pointer)paVar1;
      if ((ptVar5 == (t_cpp_generator *)0x0) ||
         (ptVar5 == (t_cpp_generator *)(this->super_t_oop_generator).super_t_generator.program_)) {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
        std::operator+(&local_110,&local_150,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var_00,iVar3));
        this_00 = &local_110;
        std::__cxx11::string::operator=((string *)&local_130,(string *)this_00);
      }
      else {
        std::__cxx11::string::string((string *)&local_90,"cpp",(allocator *)&local_b0);
        t_program::get_namespace(&local_70,(t_program *)ptVar5,&local_90);
        namespace_prefix(&local_d0,ptVar5,&local_70);
        std::operator+(&local_f0,&local_150,&local_d0);
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
        std::operator+(&local_110,&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar3));
        std::__cxx11::string::operator=((string *)&local_130,(string *)&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_70);
        this_00 = &local_90;
      }
      std::__cxx11::string::~string((string *)this_00);
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if (((char)iVar3 != '\0') && (this->gen_pure_enums_ == false)) {
        std::__cxx11::string::append((char *)&local_130);
      }
      if (arg) {
        bVar2 = is_complex_type(this,ttype);
        if (bVar2) {
          std::operator+(&local_110,"const ",&local_130);
          std::operator+(__return_storage_ptr__,&local_110,"&");
          std::__cxx11::string::~string((string *)&local_110);
        }
        else {
          std::operator+(__return_storage_ptr__,"const ",&local_130);
        }
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p == paVar1) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                        local_130.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_130.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_130._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                        local_130.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = local_130._M_string_length;
        local_130._M_string_length = 0;
        local_130.field_2._M_local_buf[0] = '\0';
        local_130._M_dataplus._M_p = (pointer)paVar1;
      }
      goto LAB_0016b8fb;
    }
    local_150._M_string_length = 0;
    local_150.field_2._M_local_buf[0] = '\0';
    if (ttype[1].super_t_doc.doc_.field_2._M_local_buf[8] == '\x01') {
      std::__cxx11::string::string((string *)&local_130,(string *)(ttype + 1));
      this_01 = &local_130;
      std::__cxx11::string::operator=((string *)&local_150,(string *)this_01);
LAB_0016b8c7:
      std::__cxx11::string::~string((string *)this_01);
    }
    else {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
      if ((char)iVar3 != '\0') {
        type_name_abi_cxx11_
                  (&local_b0,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,in_typedef,false);
        std::operator+(&local_d0,"std::map<",&local_b0);
        std::operator+(&local_f0,&local_d0,", ");
        type_name_abi_cxx11_
                  (&local_50,this,*(t_type **)&ttype[1].annotations_._M_t._M_impl,in_typedef,false);
        std::operator+(&local_110,&local_f0,&local_50);
        std::operator+(&local_130,&local_110,"> ");
        std::__cxx11::string::operator=((string *)&local_150,(string *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_d0);
        this_01 = &local_b0;
        goto LAB_0016b8c7;
      }
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar3 != '\0') {
        type_name_abi_cxx11_
                  (&local_f0,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,in_typedef,false);
        std::operator+(&local_110,"std::set<",&local_f0);
        std::operator+(&local_130,&local_110,"> ");
LAB_0016b89e:
        std::__cxx11::string::operator=((string *)&local_150,(string *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        this_01 = &local_f0;
        goto LAB_0016b8c7;
      }
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar3 != '\0') {
        type_name_abi_cxx11_
                  (&local_f0,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,in_typedef,false);
        std::operator+(&local_110,"std::vector<",&local_f0);
        std::operator+(&local_130,&local_110,"> ");
        goto LAB_0016b89e;
      }
    }
    if (!arg) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                      local_150.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_150.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_150._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                      local_150.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_150._M_string_length;
      goto LAB_0016b93c;
    }
    std::operator+(&local_130,"const ",&local_150);
    std::operator+(__return_storage_ptr__,&local_130,"&");
  }
  else {
    base_type_name_abi_cxx11_(&local_150,ptVar5,*(t_base *)&ttype[1].super_t_doc._vptr_t_doc);
    std::__cxx11::string::string((string *)&local_130,"cpp.type",(allocator *)&local_110);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(ttype->annotations_)._M_t,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(ttype->annotations_)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_assign((string *)&local_150);
    }
    if (!arg) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p == &local_150.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                      local_150.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_150.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_150._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                      local_150.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_150._M_string_length;
LAB_0016b93c:
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      local_150._M_string_length = 0;
      local_150.field_2._M_local_buf[0] = '\0';
      goto LAB_0016b947;
    }
    if (*(int *)&ttype[1].super_t_doc._vptr_t_doc != 1) {
      std::operator+(__return_storage_ptr__,"const ",&local_150);
      goto LAB_0016b947;
    }
    std::operator+(&local_130,"const ",&local_150);
    std::operator+(__return_storage_ptr__,&local_130,"&");
  }
LAB_0016b8fb:
  std::__cxx11::string::~string((string *)&local_130);
LAB_0016b947:
  std::__cxx11::string::~string((string *)&local_150);
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::type_name(t_type* ttype, bool in_typedef, bool arg) {
  if (ttype->is_base_type()) {
    string bname = base_type_name(((t_base_type*)ttype)->get_base());
    std::map<string, string>::iterator it = ttype->annotations_.find("cpp.type");
    if (it != ttype->annotations_.end()) {
      bname = it->second;
    }

    if (!arg) {
      return bname;
    }

    if (((t_base_type*)ttype)->get_base() == t_base_type::TYPE_STRING) {
      return "const " + bname + "&";
    } else {
      return "const " + bname;
    }
  }

  // Check for a custom overloaded C++ name
  if (ttype->is_container()) {
    string cname;

    t_container* tcontainer = (t_container*)ttype;
    if (tcontainer->has_cpp_name()) {
      cname = tcontainer->get_cpp_name();
    } else if (ttype->is_map()) {
      t_map* tmap = (t_map*)ttype;
      cname = "std::map<" + type_name(tmap->get_key_type(), in_typedef) + ", "
              + type_name(tmap->get_val_type(), in_typedef) + "> ";
    } else if (ttype->is_set()) {
      t_set* tset = (t_set*)ttype;
      cname = "std::set<" + type_name(tset->get_elem_type(), in_typedef) + "> ";
    } else if (ttype->is_list()) {
      t_list* tlist = (t_list*)ttype;
      cname = "std::vector<" + type_name(tlist->get_elem_type(), in_typedef) + "> ";
    }

    if (arg) {
      return "const " + cname + "&";
    } else {
      return cname;
    }
  }

  string class_prefix;
  if (in_typedef && (ttype->is_struct() || ttype->is_xception())) {
    class_prefix = "class ";
  }

  // Check if it needs to be namespaced
  string pname;
  t_program* program = ttype->get_program();
  if (program != nullptr && program != program_) {
    pname = class_prefix + namespace_prefix(program->get_namespace("cpp")) + ttype->get_name();
  } else {
    pname = class_prefix + ttype->get_name();
  }

  if (ttype->is_enum() && !gen_pure_enums_) {
    pname += "::type";
  }

  if (arg) {
    if (is_complex_type(ttype)) {
      return "const " + pname + "&";
    } else {
      return "const " + pname;
    }
  } else {
    return pname;
  }
}